

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  float fVar2;
  float fVar3;
  short sVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  byte bVar9;
  ImVec2 IVar10;
  char cVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  ImGuiWindow *pIVar16;
  float fVar17;
  ImGuiWindow *pIVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pIVar7 = GImGui;
  pIVar18 = GImGui->MovingWindow;
  pIVar16 = (ImGuiWindow *)0x0;
  if ((pIVar18 != (ImGuiWindow *)0x0) && ((pIVar18->Flags & 0x200) == 0)) {
    pIVar16 = pIVar18;
  }
  pIVar1 = &(GImGui->Style).TouchExtraPadding;
  IVar10 = *pIVar1;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar20._8_8_ = 0;
    auVar20._0_4_ = (GImGui->Style).TouchExtraPadding.x;
    auVar20._4_4_ = (GImGui->Style).TouchExtraPadding.y;
    auVar21._8_4_ = 0x40800000;
    auVar21._0_8_ = 0x4080000040800000;
    auVar21._12_4_ = 0x40800000;
    auVar20 = vmaxps_avx(auVar20,auVar21);
    IVar10 = auVar20._0_8_;
  }
  lVar12 = (long)(GImGui->Windows).Size;
  if (lVar12 < 1) {
    pIVar8 = (ImGuiWindow *)0x0;
  }
  else {
    lVar12 = lVar12 + 1;
    pIVar8 = (ImGuiWindow *)0x0;
    do {
      pIVar6 = (GImGui->Windows).Data[lVar12 + -2];
      bVar19 = false;
      if (((pIVar6->Active == true) && (pIVar6->Hidden == false)) &&
         (uVar5 = pIVar6->Flags, (uVar5 >> 9 & 1) == 0)) {
        fVar15 = pIVar1->x;
        if ((uVar5 & 0x1000042) == 0) {
          fVar15 = IVar10.x;
        }
        fVar2 = (GImGui->IO).MousePos.x;
        if ((pIVar6->OuterRectClipped).Min.x - fVar15 <= fVar2) {
          fVar17 = (GImGui->Style).TouchExtraPadding.y;
          if ((uVar5 & 0x1000042) == 0) {
            fVar17 = IVar10.y;
          }
          fVar3 = (GImGui->IO).MousePos.y;
          if ((((pIVar6->OuterRectClipped).Min.y - fVar17 <= fVar3) &&
              (fVar2 < fVar15 + (pIVar6->OuterRectClipped).Max.x)) &&
             (fVar3 < fVar17 + (pIVar6->OuterRectClipped).Max.y)) {
            sVar4 = (pIVar6->HitTestHoleSize).x;
            if (sVar4 != 0) {
              fVar15 = (float)(int)(pIVar6->HitTestHoleOffset).x + (pIVar6->Pos).x;
              if (fVar15 <= fVar2) {
                fVar17 = (float)(int)(pIVar6->HitTestHoleOffset).y + (pIVar6->Pos).y;
                auVar20 = vcmpps_avx(ZEXT416((uint)fVar3),
                                     ZEXT416((uint)(fVar17 + (float)(int)(pIVar6->HitTestHoleSize).y
                                                   )),1);
                auVar21 = vcmpps_avx(ZEXT416((uint)fVar2),
                                     ZEXT416((uint)(fVar15 + (float)(int)sVar4)),1);
                auVar20 = vandps_avx(auVar21,auVar20);
                bVar9 = auVar20[0] & fVar17 <= fVar3;
              }
              else {
                bVar9 = 0;
              }
              if (bVar9 != 0) {
                bVar19 = false;
                goto LAB_00151478;
              }
            }
            if (pIVar16 == (ImGuiWindow *)0x0) {
              pIVar16 = pIVar6;
            }
            if (((pIVar8 == (ImGuiWindow *)0x0) && (pIVar8 = pIVar6, pIVar18 != (ImGuiWindow *)0x0))
               && (pIVar6->RootWindow == pIVar18->RootWindow)) {
              pIVar8 = (ImGuiWindow *)0x0;
            }
            bVar19 = pIVar8 != (ImGuiWindow *)0x0 && pIVar16 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_00151478:
    } while ((!bVar19) && (lVar12 = lVar12 + -1, 1 < lVar12));
  }
  GImGui->HoveredWindow = pIVar16;
  if (pIVar16 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar16->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar18;
  pIVar7->HoveredWindowUnderMovingWindow = pIVar8;
  pIVar8 = GetTopMostPopupModal();
  bVar19 = false;
  if ((pIVar8 != (ImGuiWindow *)0x0) && (bVar19 = false, pIVar18 != (ImGuiWindow *)0x0)) {
    if (pIVar18->RootWindow == pIVar8) {
      bVar19 = false;
    }
    else {
      do {
        bVar19 = pIVar18 == pIVar8;
        if (bVar19) goto LAB_001514e6;
        pIVar18 = pIVar18->ParentWindow;
      } while (pIVar18 != (ImGuiWindow *)0x0);
      bVar19 = false;
LAB_001514e6:
      bVar19 = (bool)(bVar19 ^ 1);
    }
  }
  uVar5 = (pIVar7->IO).ConfigFlags;
  iVar13 = -1;
  lVar12 = 0;
  bVar9 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar12] == true) {
      bVar14 = true;
      if (pIVar16 == (ImGuiWindow *)0x0) {
        bVar14 = 0 < (pIVar7->OpenPopupStack).Size;
      }
      (pIVar7->IO).MouseDownOwned[lVar12] = bVar14;
    }
    bVar14 = (pIVar7->IO).MouseDown[lVar12];
    if ((bVar14 == true) &&
       ((iVar13 == -1 ||
        ((pIVar7->IO).MouseClickedTime[lVar12] < (pIVar7->IO).MouseClickedTime[iVar13])))) {
      iVar13 = (int)lVar12;
    }
    bVar9 = bVar9 & 1 | bVar14;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  bVar14 = true;
  if ((uVar5 & 0x10) == 0) {
    bVar14 = bVar19;
  }
  cVar11 = '\x01';
  if (iVar13 != -1) {
    cVar11 = (pIVar7->IO).MouseDownOwned[iVar13];
  }
  bVar19 = true;
  if ((pIVar7->DragDropActive == true) && (bVar19 = true, (pIVar7->DragDropSourceFlags & 0x10) != 0)
     ) {
    bVar19 = bVar14;
  }
  if (cVar11 != '\0') {
    bVar19 = bVar14;
  }
  if (bVar19) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar7->WantCaptureMouseNextFrame == -1) {
    if ((cVar11 == '\0') ||
       ((bVar19 = true, pIVar7->HoveredWindow == (ImGuiWindow *)0x0 && (bVar9 == 0)))) {
      bVar19 = 0 < (pIVar7->OpenPopupStack).Size;
    }
    (pIVar7->IO).WantCaptureMouse = bVar19;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
    bVar19 = pIVar7->ActiveId != 0 || pIVar8 != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = pIVar7->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar7->IO).WantCaptureKeyboard = bVar19;
  if (((uVar5 & 9) == 1 & (pIVar7->IO).NavActive) == 1) {
    (pIVar7->IO).WantCaptureKeyboard = true;
  }
  (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}